

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alstring.cpp
# Opt level: O2

int al::strncasecmp(char *__s1,char *__s2,size_t __n)

{
  char ch;
  char ch_00;
  int iVar1;
  int iVar2;
  long lVar3;
  int unaff_R13D;
  
  if (__n == 0) {
    unaff_R13D = 0;
  }
  else {
    lVar3 = 0;
    while( true ) {
      ch = __s1[lVar3];
      iVar1 = anon_unknown.dwarf_291ec2::to_upper(ch);
      ch_00 = __s2[lVar3];
      iVar2 = anon_unknown.dwarf_291ec2::to_upper(ch_00);
      if (iVar1 != iVar2) {
        unaff_R13D = 1;
      }
      if (iVar1 < iVar2) {
        unaff_R13D = -1;
      }
      if (iVar1 != iVar2) break;
      if (__n - 1 == lVar3) {
        return 0;
      }
      if (ch == '\0') {
        return 0;
      }
      lVar3 = lVar3 + 1;
      if (ch_00 == '\0') {
        return 0;
      }
    }
  }
  return unaff_R13D;
}

Assistant:

int strncasecmp(const char *str0, const char *str1, std::size_t len) noexcept
{
    if(len > 0)
    {
        do {
            const int diff{to_upper(*str0) - to_upper(*str1)};
            if(diff < 0) return -1;
            if(diff > 0) return 1;
        } while(--len && *(str0++) && *(str1++));
    }
    return 0;
}